

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void __thiscall ImGuiTextBuffer::appendfv(ImGuiTextBuffer *this,char *fmt,__va_list_tag *args)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  int iVar5;
  char *pcVar6;
  int iVar7;
  int iVar8;
  va_list args_copy;
  __va_list_tag local_48;
  
  local_48.reg_save_area = args->reg_save_area;
  local_48.gp_offset = args->gp_offset;
  local_48.fp_offset = args->fp_offset;
  local_48.overflow_arg_area = args->overflow_arg_area;
  iVar5 = ImFormatStringV((char *)0x0,0,fmt,args);
  if (0 < iVar5) {
    iVar8 = (this->Buf).Size;
    iVar3 = (this->Buf).Capacity;
    iVar8 = iVar8 + (uint)(iVar8 == 0);
    iVar2 = iVar5 + iVar8;
    if (iVar3 <= iVar2) {
      iVar7 = iVar3 * 2;
      if (iVar3 * 2 < iVar2) {
        iVar7 = iVar2;
      }
      if (iVar3 < iVar7) {
        if (GImGui != (ImGuiContext *)0x0) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + 1;
        }
        pcVar6 = (char *)(*GImAllocatorAllocFunc)((long)iVar7,GImAllocatorUserData);
        pcVar4 = (this->Buf).Data;
        if (pcVar4 != (char *)0x0) {
          memcpy(pcVar6,pcVar4,(long)(this->Buf).Size);
          pcVar4 = (this->Buf).Data;
          if ((pcVar4 != (char *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
            piVar1 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar1 = *piVar1 + -1;
          }
          (*GImAllocatorFreeFunc)(pcVar4,GImAllocatorUserData);
        }
        (this->Buf).Data = pcVar6;
        (this->Buf).Capacity = iVar7;
      }
    }
    iVar3 = (this->Buf).Capacity;
    if (iVar3 < iVar2) {
      if (iVar3 == 0) {
        iVar7 = 8;
      }
      else {
        iVar7 = iVar3 / 2 + iVar3;
      }
      if (iVar7 <= iVar2) {
        iVar7 = iVar2;
      }
      if (iVar3 < iVar7) {
        if (GImGui != (ImGuiContext *)0x0) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + 1;
        }
        pcVar6 = (char *)(*GImAllocatorAllocFunc)((long)iVar7,GImAllocatorUserData);
        pcVar4 = (this->Buf).Data;
        if (pcVar4 != (char *)0x0) {
          memcpy(pcVar6,pcVar4,(long)(this->Buf).Size);
          pcVar4 = (this->Buf).Data;
          if ((pcVar4 != (char *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
            piVar1 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar1 = *piVar1 + -1;
          }
          (*GImAllocatorFreeFunc)(pcVar4,GImAllocatorUserData);
        }
        (this->Buf).Data = pcVar6;
        (this->Buf).Capacity = iVar7;
      }
    }
    (this->Buf).Size = iVar2;
    ImFormatStringV((this->Buf).Data + (long)iVar8 + -1,(ulong)(iVar5 + 1),fmt,&local_48);
  }
  return;
}

Assistant:

void ImGuiTextBuffer::appendfv(const char* fmt, va_list args)
{
    va_list args_copy;
    va_copy(args_copy, args);

    int len = ImFormatStringV(NULL, 0, fmt, args);         // FIXME-OPT: could do a first pass write attempt, likely successful on first pass.
    if (len <= 0)
    {
        va_end(args_copy);
        return;
    }

    // Add zero-terminator the first time
    const int write_off = (Buf.Size != 0) ? Buf.Size : 1;
    const int needed_sz = write_off + len;
    if (write_off + len >= Buf.Capacity)
    {
        int new_capacity = Buf.Capacity * 2;
        Buf.reserve(needed_sz > new_capacity ? needed_sz : new_capacity);
    }

    Buf.resize(needed_sz);
    ImFormatStringV(&Buf[write_off - 1], (size_t)len + 1, fmt, args_copy);
    va_end(args_copy);
}